

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_unnest.cpp
# Opt level: O2

void __thiscall
duckdb::UnnestOperatorState::UnnestOperatorState
          (UnnestOperatorState *this,ClientContext *context,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *select_list)

{
  pointer puVar1;
  pointer pEVar2;
  BoundUnnestExpression *pBVar3;
  Allocator *allocator;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *exp;
  pointer this_00;
  uint local_94;
  UnnestOperatorState *local_90;
  vector<duckdb::UnifiedVectorFormat,_true> *local_88;
  vector<duckdb::UnifiedVectorFormat,_true> *local_80;
  DataChunk *local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_70;
  vector<duckdb::SelectionVector,_true> *local_68;
  vector<duckdb::SelectionVector,_true> *local_60;
  vector<duckdb::LogicalType,_true> list_data_types;
  
  (this->super_OperatorState)._vptr_OperatorState = (_func_int **)&PTR__UnnestOperatorState_017a5018
  ;
  (this->unnest_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->current_row = 0;
  this->list_position = 0;
  (this->unnest_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->unnest_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->first_fetch = true;
  SelectionVector::SelectionVector(&this->input_sel,0x800);
  local_60 = &this->unnest_sels;
  local_68 = &this->null_sels;
  local_70 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->null_counts;
  (this->null_counts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->null_counts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->null_sels).super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
  super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->null_sels).super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
  super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unnest_sels).
  super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
  super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->null_sels).super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
  super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unnest_sels).
  super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
  super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unnest_sels).
  super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
  super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->null_counts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_90 = this;
  ExpressionExecutor::ExpressionExecutor(&this->executor,context);
  local_78 = &this->list_data;
  DataChunk::DataChunk(local_78);
  local_80 = &this->list_vector_data;
  local_88 = &this->list_child_data;
  (this->list_child_data).
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list_child_data).
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->list_vector_data).
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->list_child_data).
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list_vector_data).
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list_vector_data).
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list_data_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  list_data_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  list_data_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (select_list->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (select_list->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    pBVar3 = BaseExpression::Cast<duckdb::BoundUnnestExpression>(&pEVar2->super_BaseExpression);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&pBVar3->child);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&list_data_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pEVar2->return_type);
    ExpressionExecutor::AddExpression
              (&this->executor,
               (pBVar3->child).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl);
    local_94 = 0x800;
    ::std::vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>::
    emplace_back<unsigned_int>
              (&local_60->
                super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>,
               &local_94);
    local_94 = 0x800;
    ::std::vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>::
    emplace_back<unsigned_int>
              (&local_68->
                super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>,
               &local_94);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (local_70,((long)list_data_types.
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             .
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)list_data_types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  allocator = Allocator::Get(context);
  DataChunk::Initialize(local_78,allocator,&list_data_types,0x800);
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::resize
            (&local_80->
              super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
             ,((long)(local_90->list_data).data.
                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(local_90->list_data).data.
                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x68);
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::resize
            (&local_88->
              super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
             ,((long)(local_90->list_data).data.
                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(local_90->list_data).data.
                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x68);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&list_data_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return;
}

Assistant:

UnnestOperatorState(ClientContext &context, const vector<unique_ptr<Expression>> &select_list)
	    : current_row(0), list_position(0), first_fetch(true), input_sel(STANDARD_VECTOR_SIZE), executor(context) {

		// for each UNNEST in the select_list, we add the child expression to the expression executor
		// and set the return type in the list_data chunk, which will contain the evaluated expression results
		vector<LogicalType> list_data_types;
		for (auto &exp : select_list) {
			D_ASSERT(exp->GetExpressionType() == ExpressionType::BOUND_UNNEST);
			auto &bue = exp->Cast<BoundUnnestExpression>();
			list_data_types.push_back(bue.child->return_type);
			executor.AddExpression(*bue.child.get());

			unnest_sels.emplace_back(STANDARD_VECTOR_SIZE);
			null_sels.emplace_back(STANDARD_VECTOR_SIZE);
		}
		null_counts.resize(list_data_types.size());

		auto &allocator = Allocator::Get(context);
		list_data.Initialize(allocator, list_data_types);

		list_vector_data.resize(list_data.ColumnCount());
		list_child_data.resize(list_data.ColumnCount());
	}